

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map.cc
# Opt level: O0

bool __thiscall
bloaty::RangeMap::AddRangeWithTranslation
          (RangeMap *this,uint64_t addr,uint64_t size,string *val,RangeMap *translator,bool verbose,
          RangeMap *other)

{
  const_iterator iter;
  bool bVar1;
  undefined8 size_00;
  pointer ppVar2;
  uint64_t *in_RCX;
  uint64_t in_RDX;
  RangeMap *in_RSI;
  uint64_t in_RDI;
  byte in_R9B;
  uint64_t trimmed_size;
  uint64_t trimmed_addr;
  uint64_t translated_addr;
  uint64_t total_size;
  uint64_t end;
  const_iterator it;
  string *in_stack_ffffffffffffff78;
  uint7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> iter_00;
  long local_68;
  uint64_t *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  uint64_t addr_00;
  RangeMap *this_00;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> _Var3;
  
  size_00 = FindContaining((RangeMap *)in_stack_ffffffffffffffa8,(uint64_t)in_stack_ffffffffffffffa0
                          );
  if (in_RDX == 0xffffffffffffffff) {
    this_00 = (RangeMap *)&(in_RSI->mappings_)._M_t._M_impl.field_0x1;
  }
  else {
    this_00 = (RangeMap *)(&(in_RSI->mappings_)._M_t._M_impl.field_0x0 + in_RDX);
    if (this_00 < in_RSI) {
      __assert_fail("end >= addr",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/range_map.cc"
                    ,0x108,
                    "bool bloaty::RangeMap::AddRangeWithTranslation(uint64_t, uint64_t, const std::string &, const RangeMap &, bool, RangeMap *)"
                   );
    }
  }
  addr_00 = 0;
  while( true ) {
    iter._M_node._7_1_ = in_stack_ffffffffffffff87;
    iter._M_node._0_7_ = in_stack_ffffffffffffff80;
    iter_00._M_node = (_Base_ptr)size_00;
    bVar1 = IterIsEnd((RangeMap *)in_stack_ffffffffffffff78,iter);
    in_stack_ffffffffffffff87 = false;
    if (!bVar1) {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
               operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
                           *)(ulong)in_stack_ffffffffffffff80);
      in_stack_ffffffffffffff87 = (RangeMap *)ppVar2->first < this_00;
    }
    if ((bool)in_stack_ffffffffffffff87 == false) break;
    in_stack_ffffffffffffff78 = (string *)&local_68;
    _Var3._M_node = iter_00._M_node;
    bVar1 = TranslateAndTrimRangeWithEntry<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                      (this_00,iter_00,addr_00,size_00,(uint64_t *)in_stack_ffffffffffffffa8,
                       in_stack_ffffffffffffffa0,in_RCX);
    if (bVar1) {
      if ((2 < verbose_level) || ((in_R9B & 1) != 0)) {
        printf("  -> translates to: [%lx %lx]\n",in_stack_ffffffffffffffa8,local_68);
      }
      AddRange((RangeMap *)iter_00._M_node,in_RDI,
               CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
    }
    AddRange((RangeMap *)iter_00._M_node,in_RDI,
             CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78
            );
    addr_00 = local_68 + addr_00;
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
    operator++((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> *)
               CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    size_00 = _Var3._M_node;
  }
  return addr_00 == in_RDX;
}

Assistant:

bool RangeMap::AddRangeWithTranslation(uint64_t addr, uint64_t size,
                                       const std::string& val,
                                       const RangeMap& translator,
                                       bool verbose,
                                       RangeMap* other) {
  auto it = translator.FindContaining(addr);
  uint64_t end;
  if (size == kUnknownSize) {
    end = addr + 1;
  } else {
    end = addr + size;
    assert(end >= addr);
  }
  uint64_t total_size = 0;

  // TODO: optionally warn about when we span ranges of the translator.  In some
  // cases this would be a bug (ie. symbols VM->file).  In other cases it's
  // totally normal (ie. archive members file->VM).
  while (!translator.IterIsEnd(it) && it->first < end) {
    uint64_t translated_addr;
    uint64_t trimmed_addr;
    uint64_t trimmed_size;
    if (translator.TranslateAndTrimRangeWithEntry(
            it, addr, size, &trimmed_addr, &translated_addr, &trimmed_size)) {
      if (verbose_level > 2 || verbose) {
        printf("  -> translates to: [%" PRIx64 " %" PRIx64 "]\n", translated_addr,
               trimmed_size);
      }
      other->AddRange(translated_addr, trimmed_size, val);
    }
    AddRange(trimmed_addr, trimmed_size, val);
    total_size += trimmed_size;
    ++it;
  }

  return total_size == size;
}